

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  ScopePool *pSVar1;
  bool bVar2;
  pointer ppcVar3;
  pointer ppSVar4;
  bool bVar5;
  bool bVar6;
  
  ppSVar4 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar5 = ppSVar4 ==
          (this->FunctionScopes).
          super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  while (!bVar5) {
    pSVar1 = *ppSVar4;
    ppcVar3 = (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar6 = ppcVar3 !=
            (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar6) {
      bVar2 = cmFileLock::IsLocked(*ppcVar3,filename);
      while (!bVar2) {
        ppcVar3 = ppcVar3 + 1;
        bVar2 = ppcVar3 ==
                (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        bVar6 = !bVar2;
        if (bVar2) break;
        bVar2 = cmFileLock::IsLocked(*ppcVar3,filename);
      }
    }
    if (bVar6) {
      if (!bVar5) {
        return true;
      }
      break;
    }
    ppSVar4 = ppSVar4 + 1;
    bVar5 = ppSVar4 ==
            (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  ppSVar4 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar5 = ppSVar4 !=
            (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar5) {
LAB_0048645b:
      ppcVar3 = (this->ProcessScope).Locks.
                super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar5 = ppcVar3 !=
              (this->ProcessScope).Locks.
              super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (bVar5) {
        bVar6 = cmFileLock::IsLocked(*ppcVar3,filename);
        while (!bVar6) {
          ppcVar3 = ppcVar3 + 1;
          bVar6 = ppcVar3 ==
                  (this->ProcessScope).Locks.
                  super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
          bVar5 = !bVar6;
          if (bVar6) {
            return bVar5;
          }
          bVar6 = cmFileLock::IsLocked(*ppcVar3,filename);
        }
      }
      return bVar5;
    }
    pSVar1 = *ppSVar4;
    ppcVar3 = (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar6 = ppcVar3 !=
            (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar6) {
      bVar2 = cmFileLock::IsLocked(*ppcVar3,filename);
      while (!bVar2) {
        ppcVar3 = ppcVar3 + 1;
        bVar2 = ppcVar3 ==
                (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        bVar6 = !bVar2;
        if (bVar2) break;
        bVar2 = cmFileLock::IsLocked(*ppcVar3,filename);
      }
    }
    if (bVar6) {
      if (bVar5) {
        return true;
      }
      goto LAB_0048645b;
    }
    ppSVar4 = ppSVar4 + 1;
  } while( true );
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin(); i != this->FunctionScopes.end();
       ++i) {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i) {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}